

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O1

bool __thiscall QOpenGLFunctions::hasOpenGLFeature(QOpenGLFunctions *this,OpenGLFeature feature)

{
  QOpenGLFunctionsPrivate *pQVar1;
  int iVar2;
  bool bVar3;
  
  pQVar1 = this->d_ptr;
  if (pQVar1 == (QOpenGLFunctionsPrivate *)0x0) {
    bVar3 = false;
  }
  else {
    if (*(int *)((long)&pQVar1[2].field_0 + 0x25c) == -1) {
      iVar2 = qt_gl_resolve_features();
      *(int *)((long)&pQVar1[2].field_0 + 0x25c) = iVar2;
    }
    bVar3 = (*(OpenGLFeature *)((long)&pQVar1[2].field_0 + 0x25c) & feature) != 0;
  }
  return bVar3;
}

Assistant:

bool QOpenGLFunctions::hasOpenGLFeature(QOpenGLFunctions::OpenGLFeature feature) const
{
    QOpenGLFunctionsPrivateEx *d = static_cast<QOpenGLFunctionsPrivateEx *>(d_ptr);
    if (!d)
        return false;
    if (d->m_features == -1)
        d->m_features = qt_gl_resolve_features();
    return (d->m_features & int(feature)) != 0;
}